

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ReserveSpaceForPipelineDesc
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,
          RayTracingPipelineStateCreateInfo *CreateInfo,FixedLinearAllocator *MemPool)

{
  RenderDeviceVkImpl *pRVar1;
  long lVar2;
  Uint32 i;
  ulong uVar3;
  
  pRVar1 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                      );
  FixedLinearAllocator::AddSpace
            (MemPool,((ulong)CreateInfo->ProceduralHitShaderCount +
                     (ulong)CreateInfo->TriangleHitShaderCount +
                     (ulong)CreateInfo->GeneralShaderCount) *
                     (ulong)(pRVar1->
                            super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                            ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.
                            RayTracing.ShaderGroupHandleSize + 0x48,8);
  lVar2 = 0;
  for (uVar3 = 0; uVar3 < CreateInfo->GeneralShaderCount; uVar3 = uVar3 + 1) {
    FixedLinearAllocator::AddSpaceForString
              (MemPool,*(Char **)((long)&CreateInfo->pGeneralShaders->Name + lVar2),0);
    lVar2 = lVar2 + 0x10;
  }
  lVar2 = 0;
  for (uVar3 = 0; uVar3 < CreateInfo->TriangleHitShaderCount; uVar3 = uVar3 + 1) {
    FixedLinearAllocator::AddSpaceForString
              (MemPool,*(Char **)((long)&CreateInfo->pTriangleHitShaders->Name + lVar2),0);
    lVar2 = lVar2 + 0x18;
  }
  lVar2 = 0;
  for (uVar3 = 0; uVar3 < CreateInfo->ProceduralHitShaderCount; uVar3 = uVar3 + 1) {
    FixedLinearAllocator::AddSpaceForString
              (MemPool,*(Char **)((long)&CreateInfo->pProceduralHitShaders->Name + lVar2),0);
    lVar2 = lVar2 + 0x20;
  }
  ReserveResourceLayout(&(CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout,MemPool)
  ;
  ReserveResourceSignatures(this,&CreateInfo->super_PipelineStateCreateInfo,MemPool);
  return;
}

Assistant:

void ReserveSpaceForPipelineDesc(const RayTracingPipelineStateCreateInfo& CreateInfo,
                                     FixedLinearAllocator&                    MemPool) noexcept
    {
        size_t RTDataSize = sizeof(RayTracingPipelineData);
        // Reserve space for shader handles
        const Uint32 ShaderHandleSize = this->GetDevice()->GetAdapterInfo().RayTracing.ShaderGroupHandleSize;
        RTDataSize += size_t{ShaderHandleSize} *
            (size_t{CreateInfo.GeneralShaderCount} +
             size_t{CreateInfo.TriangleHitShaderCount} +
             size_t{CreateInfo.ProceduralHitShaderCount});
        // Extra bytes were reserved to avoid compiler errors on zero-sized arrays
        RTDataSize -= sizeof(RayTracingPipelineData::ShaderHandles);
        MemPool.AddSpace(RTDataSize, alignof(RayTracingPipelineData));

        for (Uint32 i = 0; i < CreateInfo.GeneralShaderCount; ++i)
        {
            MemPool.AddSpaceForString(CreateInfo.pGeneralShaders[i].Name);
        }
        for (Uint32 i = 0; i < CreateInfo.TriangleHitShaderCount; ++i)
        {
            MemPool.AddSpaceForString(CreateInfo.pTriangleHitShaders[i].Name);
        }
        for (Uint32 i = 0; i < CreateInfo.ProceduralHitShaderCount; ++i)
        {
            MemPool.AddSpaceForString(CreateInfo.pProceduralHitShaders[i].Name);
        }

        ReserveResourceLayout(CreateInfo.PSODesc.ResourceLayout, MemPool);
        ReserveResourceSignatures(CreateInfo, MemPool);
    }